

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::update(Forth *this)

{
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  
  _Var1 = this->blockCurrent;
  if (_Var1 != _S_red) {
    p_Var4 = &(this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &p_Var4->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[bVar5]) {
      bVar5 = p_Var3[1]._M_color < _Var1;
      if (!bVar5) {
        p_Var2 = p_Var3;
      }
    }
    p_Var3 = &p_Var4->_M_header;
    if (((_Rb_tree_header *)p_Var2 != p_Var4) && (p_Var3 = p_Var2, _Var1 < p_Var2[1]._M_color)) {
      p_Var3 = &p_Var4->_M_header;
    }
    if ((_Rb_tree_header *)p_Var3 != p_Var4) {
      *(undefined1 *)((long)&p_Var3[1]._M_parent + 4) = 1;
    }
  }
  return;
}

Assistant:

void update(){
			Cell u = blockCurrent;
			if (u > 0) {
				auto foundIt = blocksInProcess.find(u);
				if (foundIt != blocksInProcess.end()) {
					(*foundIt).second.blockModified = true;
				}
			}
		}